

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O1

uint xSAT_SolverPropagate(xSAT_Solver_t *s)

{
  iword *piVar1;
  uint uVar2;
  xSAT_VecWatchList_t *pxVar3;
  xSAT_WatchList_t *pxVar4;
  Vec_Str_t *pVVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  xSAT_Watcher_t *pxVar9;
  long lVar10;
  uint uVar11;
  uint *puVar12;
  xSAT_Watcher_t *pxVar13;
  ulong uVar14;
  uint uVar15;
  uint *puVar16;
  uint uVar17;
  ulong uVar18;
  xSAT_Watcher_t *pxVar19;
  xSAT_Watcher_t xVar20;
  uint uVar21;
  xSAT_Watcher_t *pxVar22;
  xSAT_WatchList_t *pxVar23;
  bool bVar24;
  uint local_68;
  uint local_64;
  int local_60;
  
  local_68 = 0xffffffff;
  uVar18 = 0;
  while( true ) {
    uVar2 = s->iQhead;
    if (s->vTrail->nSize <= (int)uVar2) {
      piVar1 = &(s->Stats).nPropagations;
      *piVar1 = *piVar1 + uVar18;
      s->nPropSimplify = s->nPropSimplify - uVar18;
      return local_68;
    }
    s->iQhead = uVar2 + 1;
    if ((int)uVar2 < 0) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar2 = s->vTrail->pArray[uVar2];
    pxVar3 = s->vBinWatches;
    if (pxVar3->nCap <= (int)uVar2) break;
    if (pxVar3->nSize <= (int)uVar2) {
LAB_008e7a12:
      __assert_fail("iEntry < v->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                    ,0x107,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)");
    }
    lVar10 = (long)pxVar3->pArray[(int)uVar2].nSize;
    bVar24 = 0 < lVar10;
    if (0 < lVar10) {
      pxVar22 = pxVar3->pArray[(int)uVar2].pArray;
      pxVar13 = pxVar22 + lVar10;
      do {
        uVar21 = pxVar22->Blocker;
        uVar7 = (int)uVar21 >> 1;
        if (((int)uVar7 < 0) || (s->vAssigns->nSize <= (int)uVar7)) goto LAB_008e79d4;
        uVar7 = (uint)s->vAssigns->pArray[uVar7];
        if (uVar7 == 3) {
          xSAT_SolverEnqueue(s,uVar21,pxVar22->CRef);
        }
        else if ((uVar21 & 1 ^ uVar7) == 1) {
          local_64 = pxVar22->CRef;
          goto LAB_008e799a;
        }
        pxVar22 = pxVar22 + 1;
        bVar24 = pxVar22 < pxVar13;
      } while (bVar24);
    }
    pxVar3 = s->vWatches;
    if (pxVar3->nCap <= (int)uVar2) break;
    if (pxVar3->nSize <= (int)uVar2) goto LAB_008e7a12;
    pxVar4 = pxVar3->pArray;
    pxVar13 = pxVar4[(int)uVar2].pArray;
    if (0 < (long)pxVar4[(int)uVar2].nSize) {
      pxVar19 = pxVar13 + pxVar4[(int)uVar2].nSize;
      uVar21 = uVar2 ^ 1;
      pxVar22 = pxVar13;
      do {
        uVar7 = pxVar22->Blocker >> 1;
        if (((int)uVar7 < 0) || (pVVar5 = s->vAssigns, pVVar5->nSize <= (int)uVar7))
        goto LAB_008e79d4;
        pcVar6 = pVVar5->pArray;
        if ((pxVar22->Blocker & 1U) == (int)pcVar6[uVar7]) {
          xVar20 = *pxVar22;
          pxVar22 = pxVar22 + 1;
          *pxVar13 = xVar20;
          pxVar13 = pxVar13 + 1;
        }
        else {
          if ((long)(int)pxVar22->CRef == -1) {
            puVar12 = (uint *)0x0;
          }
          else {
            puVar12 = s->pMemory->pData + (int)pxVar22->CRef;
          }
          if (puVar12[2] == uVar21) {
            puVar12[2] = puVar12[3];
            puVar12[3] = uVar21;
          }
          if (puVar12[3] != uVar21) {
            __assert_fail("Lits[1] == NegLit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatSolver.c"
                          ,0x2c9,"unsigned int xSAT_SolverPropagate(xSAT_Solver_t *)");
          }
          uVar7 = pxVar22->CRef;
          uVar11 = puVar12[2];
          if (uVar11 == pxVar22->Blocker) {
LAB_008e7789:
            if (2 < (long)(int)puVar12[1]) {
              puVar16 = puVar12 + 4;
              do {
                uVar15 = *puVar16;
                uVar17 = (int)uVar15 >> 1;
                if (((int)uVar17 < 0) || (pVVar5->nSize <= (int)uVar17)) goto LAB_008e79d4;
                if ((uVar15 & 1 ^ (int)pcVar6[uVar17]) != 1) {
                  puVar12[3] = uVar15;
                  *puVar16 = uVar21;
                  pxVar3 = s->vWatches;
                  iVar8 = (int)((long)(int)puVar12[3] ^ 1U);
                  if (pxVar3->nCap <= iVar8) goto LAB_008e7a31;
                  if (pxVar3->nSize <= iVar8) goto LAB_008e7a12;
                  if (pxVar3->pArray == (xSAT_WatchList_t *)0x0) {
                    __assert_fail("v",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                                  ,0x78,
                                  "void xSAT_WatchListPush(xSAT_WatchList_t *, xSAT_Watcher_t)");
                  }
                  pxVar23 = pxVar3->pArray + ((long)(int)puVar12[3] ^ 1U);
                  uVar15 = pxVar23->nCap;
                  if (pxVar23->nSize == uVar15) {
                    uVar14 = (ulong)((uVar15 >> 1) * 3);
                    if ((int)uVar15 < 4) {
                      uVar14 = 4;
                    }
                    if (pxVar23->pArray == (xSAT_Watcher_t *)0x0) {
                      pxVar9 = (xSAT_Watcher_t *)malloc(uVar14 * 8);
                    }
                    else {
                      pxVar9 = (xSAT_Watcher_t *)realloc(pxVar23->pArray,uVar14 * 8);
                    }
                    pxVar23->pArray = pxVar9;
                    local_60 = (int)uVar14;
                    if (pxVar9 == (xSAT_Watcher_t *)0x0) {
                      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                             (double)pxVar23->nCap * 9.5367431640625e-07,
                             (double)local_60 * 9.5367431640625e-07);
                      fflush(_stdout);
                    }
                    pxVar23->nCap = local_60;
                  }
                  xVar20.Blocker = uVar11;
                  xVar20.CRef = uVar7;
                  iVar8 = pxVar23->nSize;
                  pxVar23->nSize = iVar8 + 1;
                  pxVar23->pArray[iVar8] = xVar20;
                  iVar8 = 0xc;
                  goto LAB_008e7946;
                }
                puVar16 = puVar16 + 1;
              } while (puVar16 < puVar12 + (long)(int)puVar12[1] + 2);
            }
            pxVar13->CRef = uVar7;
            pxVar13->Blocker = uVar11;
            uVar7 = puVar12[2];
            uVar11 = (int)uVar7 >> 1;
            if (((int)uVar11 < 0) || (pVVar5->nSize <= (int)uVar11)) {
LAB_008e79d4:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            pxVar13 = pxVar13 + 1;
            uVar15 = pxVar22->CRef;
            if ((uVar7 & 1 ^ (int)pcVar6[uVar11]) == 1) {
              s->iQhead = s->vTrail->nSize;
              iVar8 = 0;
              while (pxVar22 = pxVar22 + 1, local_68 = uVar15, pxVar22 < pxVar19) {
                *pxVar13 = *pxVar22;
                pxVar13 = pxVar13 + 1;
              }
            }
            else {
              xSAT_SolverEnqueue(s,uVar7,uVar15);
              iVar8 = 0;
            }
LAB_008e7946:
            if ((iVar8 != 0xc) && (iVar8 != 0)) goto LAB_008e7953;
          }
          else {
            uVar15 = (int)uVar11 >> 1;
            if (((int)uVar15 < 0) || (pVVar5->nSize <= (int)uVar15)) goto LAB_008e79d4;
            if ((uVar11 & 1) != (int)pcVar6[uVar15]) goto LAB_008e7789;
            pxVar13->CRef = uVar7;
            pxVar13->Blocker = uVar11;
            pxVar13 = pxVar13 + 1;
          }
          pxVar22 = pxVar22 + 1;
        }
LAB_008e7953:
      } while (pxVar22 < pxVar19);
    }
    uVar14 = (long)pxVar13 - (long)pxVar4[(int)uVar2].pArray;
    piVar1 = &(s->Stats).nInspects;
    *piVar1 = *piVar1 + ((long)uVar14 >> 3);
    iVar8 = (int)(uVar14 >> 3);
    if (pxVar4[(int)uVar2].nSize < iVar8) {
      __assert_fail("k <= v->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                    ,0x67,"void xSAT_WatchListShrink(xSAT_WatchList_t *, int)");
    }
    pxVar4[(int)uVar2].nSize = iVar8;
LAB_008e799a:
    uVar18 = (ulong)((int)uVar18 + 1);
    if (bVar24) {
      return local_64;
    }
  }
LAB_008e7a31:
  __assert_fail("iEntry < v->nCap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                ,0x106,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)");
}

Assistant:

unsigned xSAT_SolverPropagate( xSAT_Solver_t* s )
{
    unsigned hConfl = CRefUndef;
    int * Lits;
    int NegLit;
    int nProp = 0;

    while ( s->iQhead < Vec_IntSize( s->vTrail ) )
    {
        int p = Vec_IntEntry( s->vTrail, s->iQhead++ );
        xSAT_WatchList_t* ws = xSAT_VecWatchListEntry( s->vBinWatches, p );
        xSAT_Watcher_t* begin = xSAT_WatchListArray( ws );
        xSAT_Watcher_t* end   = begin + xSAT_WatchListSize( ws );
        xSAT_Watcher_t *i, *j;

        nProp++;
        for ( i = begin; i < end; i++ )
        {
            if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == VarX )
                xSAT_SolverEnqueue( s, i->Blocker, i->CRef );
            else if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == xSAT_LitSign( xSAT_NegLit( i->Blocker ) ) )
                return i->CRef;
        }

        ws    = xSAT_VecWatchListEntry( s->vWatches, p );
        begin = xSAT_WatchListArray( ws );
        end   = begin + xSAT_WatchListSize( ws );

        for ( i = j = begin; i < end; )
        {
            xSAT_Clause_t * pCla;
            xSAT_Watcher_t w;
            if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == xSAT_LitSign( i->Blocker ) )
            {
                *j++ = *i++;
                continue;
            }

            pCla = xSAT_SolverReadClause( s, i->CRef );
            Lits = &( pCla->pData[0].Lit );

            // Make sure the false literal is data[1]:
            NegLit = xSAT_NegLit( p );
            if ( Lits[0] == NegLit )
            {
                Lits[0] = Lits[1];
                Lits[1] = NegLit;
            }
            assert( Lits[1] == NegLit );

            w.CRef = i->CRef;
            w.Blocker = Lits[0];

            // If 0th watch is true, then clause is already satisfied.
            if ( Lits[0] != i->Blocker && Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[0] ) ) == xSAT_LitSign( Lits[0] ) )
                *j++ = w;
            else
            {
                // Look for new watch:
                int * stop = Lits + pCla->nSize;
                int * k;
                for ( k = Lits + 2; k < stop; k++ )
                {
                    if (Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( *k ) ) != !xSAT_LitSign( *k ) )
                    {
                        Lits[1] = *k;
                        *k = NegLit;
                        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( Lits[1] ) ), w );
                        goto next;
                    }
                }

                *j++ = w;

                // Clause is unit under assignment:
                if (Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[0] ) ) == xSAT_LitSign( xSAT_NegLit( Lits[0] ) ) )
                {
                    hConfl = i->CRef;
                    i++;
                    s->iQhead = Vec_IntSize( s->vTrail );
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
                else
                    xSAT_SolverEnqueue( s, Lits[0], i->CRef );
            }
        next:
            i++;
        }

        s->Stats.nInspects += j - xSAT_WatchListArray( ws );
        xSAT_WatchListShrink( ws, j - xSAT_WatchListArray( ws ) );
    }

    s->Stats.nPropagations += nProp;
    s->nPropSimplify -= nProp;

    return hConfl;
}